

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

void __thiscall
mp::TypedSolverOption<int>::Parse(TypedSolverOption<int> *this,char **s,bool splitString)

{
  int iVar1;
  long *in_RDI;
  exception *exc;
  int value;
  char *start;
  bool in_stack_ffffffffffffff9f;
  char **in_stack_ffffffffffffffa0;
  
  iVar1 = internal::OptionHelper<int>::Parse(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  (**(code **)(*in_RDI + 0x50))(in_RDI,iVar1);
  return;
}

Assistant:

void Parse(const char *&s, bool splitString=false) override {
    const char *start = s;
    T value;
    try {
      value = internal::OptionHelper<T>::Parse(s, splitString);
    } catch (const std::exception& exc) {
      // undocumented: we accept next option after a numeric option
      s = SkipNonSpaces(s);
      throw InvalidOptionValue(name(),
                               std::string(start, s - start),
                               exc.what());
    }
    SetValue(value);
  }